

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O3

void Am_Connection::Set_Net_Instance(Am_Object *the_obj,char *proto_name,int instance_num)

{
  char *initial;
  Am_Wrapper *pAVar1;
  Am_Assoc instance_reg;
  Am_Assoc local_20;
  Am_Value local_18;
  
  initial = Net_ID_Str(proto_name,instance_num);
  Am_Value::Am_Value(&local_18,initial);
  pAVar1 = Am_Object::operator_cast_to_Am_Wrapper_(the_obj);
  Am_Assoc::Am_Assoc(&local_20,&local_18,pAVar1);
  Am_Value::~Am_Value(&local_18);
  pAVar1 = Am_Assoc::operator_cast_to_Am_Wrapper_(&local_20);
  Am_Value_List::Add(&Net_Instances,pAVar1,Am_TAIL,true);
  Am_Assoc::~Am_Assoc(&local_20);
  return;
}

Assistant:

void
Am_Connection::Set_Net_Instance(Am_Object &the_obj, const char *proto_name,
                                int instance_num)
{
  Am_Assoc instance_reg(Net_ID_Str(proto_name, instance_num), the_obj);
  Net_Instances.Add(instance_reg);
}